

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O0

Program __thiscall Inlining::run(Inlining *this,Program *program)

{
  Function *function;
  Block *pBVar1;
  Function *this_00;
  Type *return_type;
  mapped_type *pmVar2;
  Block *source_block;
  Function *extraout_RDX;
  Program PVar3;
  Function *new_function;
  undefined1 local_70 [8];
  Analyze analyze;
  FunctionTable function_table;
  Function *local_20;
  Function *main_function;
  Program *program_local;
  Program *new_program;
  
  main_function = (Function *)program;
  program_local = (Program *)this;
  local_20 = Program::get_main_function(program);
  Program::Program((Program *)this);
  std::
  map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
  ::map((map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
         *)&analyze.function);
  Analyze::Analyze((Analyze *)local_70,(FunctionTable *)&analyze.function,local_20);
  pBVar1 = Function::get_block(local_20);
  Analyze::evaluate((Analyze *)local_70,pBVar1);
  this_00 = (Function *)operator_new(0x60);
  return_type = Function::get_return_type(local_20);
  Function::Function(this_00,return_type);
  Program::add_function((Program *)this,this_00);
  pmVar2 = std::
           map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
           ::operator[]((map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
                         *)&analyze.function,&local_20);
  function = local_20;
  pmVar2->new_function = this_00;
  pBVar1 = Function::get_block(this_00);
  source_block = Function::get_block(local_20);
  Replace::evaluate((Program *)this,(FunctionTable *)&analyze.function,function,pBVar1,source_block)
  ;
  std::
  map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
  ::~map((map<const_Function_*,_Inlining::FunctionTableEntry,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Inlining::FunctionTableEntry>_>_>
          *)&analyze.function);
  PVar3.last = extraout_RDX;
  PVar3.first = (Function *)this;
  return PVar3;
}

Assistant:

static Program run(const Program& program) {
		const Function* main_function = program.get_main_function();
		Program new_program;
		FunctionTable function_table;
		Analyze analyze(function_table, main_function);
		analyze.evaluate(main_function->get_block());
		Function* new_function = new Function(main_function->get_return_type());
		new_program.add_function(new_function);
		function_table[main_function].new_function = new_function;
		Replace::evaluate(&new_program, function_table, main_function, new_function->get_block(), main_function->get_block());
		return new_program;
	}